

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::lts_20250127::str_format_internal::anon_unknown_0::
     FormatFFast<absl::lts_20250127::uint128>(uint128 v,int exp,FormatState *state)

{
  size_t sVar1;
  uint uVar2;
  string_view data_postfix;
  FormatState *state_00;
  bool bVar3;
  int amount;
  unsigned_long uVar4;
  long lVar5;
  size_t in_R9;
  uint128 lhs;
  uint128 lhs_00;
  uint128 v_00;
  uint128 v_01;
  char *local_1b0;
  char *local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  string_view local_190;
  size_type local_180;
  size_t size;
  uint64_t local_170;
  anon_unknown_0 *local_168;
  uint64_t local_160;
  lts_20250127 *local_158;
  uint64_t local_150;
  uint128 local_148;
  lts_20250127 *local_138;
  uint64_t local_130;
  uint128 local_128;
  lts_20250127 *local_118;
  uint64_t local_110;
  int local_fc;
  char *pcStack_f8;
  int total_bits;
  char *fractional_digits_end;
  char *fractional_digits_start;
  char *integral_digits_start;
  char *integral_digits_end;
  char buffer [171];
  int input_bits;
  FormatState *state_local;
  undefined1 auStack_18 [4];
  int exp_local;
  uint128 v_local;
  
  lhs_00.lo_ = v.hi_;
  _auStack_18 = (lts_20250127 *)v.lo_;
  buffer[0xa4] = -0x80;
  buffer[0xa5] = '\0';
  buffer[0xa6] = '\0';
  buffer[0xa7] = '\0';
  buffer[0x22] = '.';
  integral_digits_start = buffer + 0x22;
  pcStack_f8 = buffer + 0x23;
  fractional_digits_end = pcStack_f8;
  unique0x100002b3 = state;
  v_local.lo_ = lhs_00.lo_;
  if (exp < 0) {
    uVar2 = -exp;
    if ((int)uVar2 < 0x80) {
      lhs_00.hi_._0_4_ = uVar2;
      lhs_00.hi_._4_4_ = 0;
      local_158 = _auStack_18;
      local_150 = lhs_00.lo_;
      local_148 = operator>>(_auStack_18,lhs_00,(int)state);
    }
    else {
      uint128::uint128(&local_148,0);
    }
    fractional_digits_start = PrintIntegralDigitsFromRightFast(local_148,integral_digits_start);
    fractional_digits_start[-1] = '0';
    if ((int)uVar2 < 0x41) {
      local_168 = (anon_unknown_0 *)_auStack_18;
      local_160 = v_local.lo_;
      v_00.hi_ = (uint64_t)fractional_digits_end;
      v_00.lo_ = v_local.lo_;
      local_1b0 = PrintFractionalDigitsFast
                            ((anon_unknown_0 *)_auStack_18,v_00,(char *)(ulong)uVar2,
                             (int)stack0xffffffffffffffd8->precision,in_R9);
    }
    else {
      size = (size_t)_auStack_18;
      local_170 = v_local.lo_;
      v_01.hi_ = (uint64_t)fractional_digits_end;
      v_01.lo_ = v_local.lo_;
      local_1b0 = PrintFractionalDigitsFast
                            ((anon_unknown_0 *)_auStack_18,v_01,(char *)(ulong)uVar2,
                             (int)stack0xffffffffffffffd8->precision,in_R9);
    }
    pcStack_f8 = local_1b0;
    if (fractional_digits_start[-1] != '0') {
      fractional_digits_start = fractional_digits_start + -1;
    }
  }
  else {
    local_118 = _auStack_18;
    local_110 = lhs_00.lo_;
    amount = LeadingZeros(v);
    local_fc = (0x80 - amount) + exp;
    if (local_fc < 0x41) {
      uVar4 = uint128::operator_cast_to_unsigned_long((uint128 *)auStack_18);
      local_1a8 = PrintIntegralDigitsFromRightFast
                            (uVar4 << ((byte)exp & 0x3f),integral_digits_start);
    }
    else {
      local_138 = _auStack_18;
      local_130 = v_local.lo_;
      lhs.hi_._0_4_ = exp;
      lhs.lo_ = v_local.lo_;
      lhs.hi_._4_4_ = 0;
      local_128 = lts_20250127::operator<<(_auStack_18,lhs,amount);
      local_1a8 = PrintIntegralDigitsFromRightFast(local_128,integral_digits_start);
    }
    fractional_digits_start = local_1a8;
  }
  local_180 = (long)pcStack_f8 - (long)fractional_digits_start;
  bVar3 = FormatState::ShouldPrintDot(stack0xffffffffffffffd8);
  state_00 = stack0xffffffffffffffd8;
  if (!bVar3) {
    local_180 = local_180 - 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,fractional_digits_start,local_180);
  sVar1 = stack0xffffffffffffffd8->precision;
  lVar5 = (long)pcStack_f8 - (long)fractional_digits_end;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a0,"");
  data_postfix._M_str = local_1a0._M_str;
  data_postfix._M_len = local_1a0._M_len;
  FinalPrint(state_00,local_190,0,sVar1 - lVar5,data_postfix);
  return;
}

Assistant:

void FormatFFast(Int v, int exp, const FormatState &state) {
  constexpr int input_bits = sizeof(Int) * 8;

  static constexpr size_t integral_size =
      /* in case we need to round up an extra digit */ 1 +
      /* decimal digits for uint128 */ 40 + 1;
  char buffer[integral_size + /* . */ 1 + /* max digits uint128 */ 128];
  buffer[integral_size] = '.';
  char *const integral_digits_end = buffer + integral_size;
  char *integral_digits_start;
  char *const fractional_digits_start = buffer + integral_size + 1;
  char *fractional_digits_end = fractional_digits_start;

  if (exp >= 0) {
    const int total_bits = input_bits - LeadingZeros(v) + exp;
    integral_digits_start =
        total_bits <= 64
            ? PrintIntegralDigitsFromRightFast(static_cast<uint64_t>(v) << exp,
                                               integral_digits_end)
            : PrintIntegralDigitsFromRightFast(static_cast<uint128>(v) << exp,
                                               integral_digits_end);
  } else {
    exp = -exp;

    integral_digits_start = PrintIntegralDigitsFromRightFast(
        exp < input_bits ? v >> exp : 0, integral_digits_end);
    // PrintFractionalDigits may pull a carried 1 all the way up through the
    // integral portion.
    integral_digits_start[-1] = '0';

    fractional_digits_end =
        exp <= 64 ? PrintFractionalDigitsFast(v, fractional_digits_start, exp,
                                              state.precision)
                  : PrintFractionalDigitsFast(static_cast<uint128>(v),
                                              fractional_digits_start, exp,
                                              state.precision);
    // There was a carry, so include the first digit too.
    if (integral_digits_start[-1] != '0') --integral_digits_start;
  }

  size_t size =
      static_cast<size_t>(fractional_digits_end - integral_digits_start);

  // In `alt` mode (flag #) we keep the `.` even if there are no fractional
  // digits. In non-alt mode, we strip it.
  if (!state.ShouldPrintDot()) --size;
  FinalPrint(state, absl::string_view(integral_digits_start, size),
             /*padding_offset=*/0,
             state.precision - static_cast<size_t>(fractional_digits_end -
                                                   fractional_digits_start),
             /*data_postfix=*/"");
}